

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O0

size_t u64CLZ(u64 w)

{
  ulong uVar1;
  size_t sVar2;
  ulong in_RDI;
  
  uVar1 = in_RDI | in_RDI >> 1;
  uVar1 = uVar1 | uVar1 >> 2;
  uVar1 = uVar1 | uVar1 >> 4;
  uVar1 = uVar1 | uVar1 >> 8;
  uVar1 = uVar1 | uVar1 >> 0x10;
  sVar2 = u64Weight((uVar1 | uVar1 >> 0x20) ^ 0xffffffffffffffff);
  return sVar2;
}

Assistant:

size_t SAFE(u64CLZ)(register u64 w)
{
	w = w | w >> 1;
	w = w | w >> 2;
	w = w | w >> 4;
	w = w | w >> 8;
	w = w | w >> 16;
	w = w | w >> 32;
	return u64Weight(~w);
}